

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_dr_flac_next_vorbis_comment
                 (ma_dr_flac_vorbis_comment_iterator *pIter,ma_uint32 *pCommentLengthOut)

{
  ma_uint32 mVar1;
  char *pComment;
  ma_int32 length;
  ma_uint32 *pCommentLengthOut_local;
  ma_dr_flac_vorbis_comment_iterator *pIter_local;
  char *local_18;
  ma_uint8 *pNum;
  
  if (pCommentLengthOut != (ma_uint32 *)0x0) {
    *pCommentLengthOut = 0;
  }
  if (((pIter == (ma_dr_flac_vorbis_comment_iterator *)0x0) || (pIter->countRemaining == 0)) ||
     (pIter->pRunningData == (char *)0x0)) {
    local_18 = (char *)0x0;
  }
  else {
    mVar1 = *(ma_uint32 *)pIter->pRunningData;
    pIter->pRunningData = pIter->pRunningData + 4;
    local_18 = pIter->pRunningData;
    pIter->pRunningData = pIter->pRunningData + (int)mVar1;
    pIter->countRemaining = pIter->countRemaining - 1;
    if (pCommentLengthOut != (ma_uint32 *)0x0) {
      *pCommentLengthOut = mVar1;
    }
  }
  return local_18;
}

Assistant:

MA_API const char* ma_dr_flac_next_vorbis_comment(ma_dr_flac_vorbis_comment_iterator* pIter, ma_uint32* pCommentLengthOut)
{
    ma_int32 length;
    const char* pComment;
    if (pCommentLengthOut) {
        *pCommentLengthOut = 0;
    }
    if (pIter == NULL || pIter->countRemaining == 0 || pIter->pRunningData == NULL) {
        return NULL;
    }
    length = ma_dr_flac__le2host_32_ptr_unaligned(pIter->pRunningData);
    pIter->pRunningData += 4;
    pComment = pIter->pRunningData;
    pIter->pRunningData += length;
    pIter->countRemaining -= 1;
    if (pCommentLengthOut) {
        *pCommentLengthOut = length;
    }
    return pComment;
}